

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_diamondskin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  CHAR_DATA *in_RDX;
  int in_ESI;
  int in_EDI;
  AFFECT_DATA af;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  void *arg1;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  undefined2 uVar7;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  
  if ((double)in_RDX->hit < (double)(int)in_RDX->max_hit * 0.75) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    bVar1 = is_affected(in_RDX,in_EDI);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                    CONCAT24(in_stack_ffffffffffffff94,
                                             CONCAT22(in_stack_ffffffffffffff92,
                                                      in_stack_ffffffffffffff90))),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else {
      init_affect((AFFECT_DATA *)0x6dcb48);
      uVar6 = 0;
      uVar2 = (undefined2)in_EDI;
      sVar3 = (short)in_ESI + 8;
      sVar4 = 0x12 - (short)(in_ESI / 5);
      uVar7 = 0;
      arg1 = (void *)0x0;
      iVar5 = dice(0,in_stack_ffffffffffffff7c);
      new_affect_to_char(in_stack_ffffffffffffffa0,
                         (AFFECT_DATA *)
                         CONCAT26(8,CONCAT24(((short)iVar5 + 100) * 0x14,CONCAT22(uVar7,sVar4))));
      act((char *)CONCAT26(sVar3,CONCAT24(uVar2,CONCAT22(uVar6,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),arg1,
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      act((char *)CONCAT26(sVar3,CONCAT24(uVar2,CONCAT22(uVar6,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),arg1,
          (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      bVar1 = is_affected(in_RDX,(int)gsn_stoneskin);
      if (bVar1) {
        affect_strip((CHAR_DATA *)
                     CONCAT26(sVar3,CONCAT24(uVar2,CONCAT22(uVar6,in_stack_ffffffffffffff90))),
                     in_stack_ffffffffffffff8c);
      }
      bVar1 = is_affected(in_RDX,(int)gsn_ironskin);
      if (bVar1) {
        affect_strip((CHAR_DATA *)
                     CONCAT26(sVar3,CONCAT24(uVar2,CONCAT22(uVar6,in_stack_ffffffffffffff90))),
                     in_stack_ffffffffffffff8c);
      }
    }
  }
  return;
}

Assistant:

void spell_diamondskin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	if (!(ch->hit < ch->max_hit * .75))
	{
		if (!is_affected(ch, sn))
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.aftype = AFT_SPELL;
			af.level = level + 8;
			af.duration = 18 - level / 5;
			af.location = 0;
			af.owner = nullptr;
			af.end_fun = nullptr;
			af.modifier = (dice(5, 20) + 100) * 20;
			af.mod_name = MOD_PROTECTION;
			new_affect_to_char(ch, &af);

			act("$n concentrates, and $s skin hardens into a diamond-like carapace.", ch, 0, 0, TO_ROOM);
			act("The outer layers of your skin become almost impossibly hard.", ch, 0, 0, TO_CHAR);
			if (is_affected(ch, gsn_stoneskin))
				affect_strip(ch, gsn_stoneskin);
			if (is_affected(ch, gsn_ironskin))
				affect_strip(ch, gsn_ironskin);
		}
		else
		{
			send_to_char("Your skin is already as hard as it can become.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("You are bleeding too much to harden your skin.\n\r", ch);
		return;
	}
}